

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<char_*,_10>::TPZManVector(TPZManVector<char_*,_10> *this,TPZVec<char_*> *copy)

{
  char **ppcVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_TPZVec<char_*>).fStore = (char **)0x0;
  (this->super_TPZVec<char_*>).fNElements = 0;
  (this->super_TPZVec<char_*>).fNAlloc = 0;
  (this->super_TPZVec<char_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0164fde8;
  uVar3 = copy->fNElements;
  if ((long)uVar3 < 0xb) {
    ppcVar1 = this->fExtAlloc;
    uVar2 = 0;
  }
  else {
    ppcVar1 = (char **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    uVar2 = uVar3;
  }
  (this->super_TPZVec<char_*>).fStore = ppcVar1;
  (this->super_TPZVec<char_*>).fNElements = uVar3;
  (this->super_TPZVec<char_*>).fNAlloc = uVar2;
  uVar2 = 0;
  if ((long)uVar3 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (this->super_TPZVec<char_*>).fStore[uVar2] = copy->fStore[uVar2];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}